

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::
binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_dedicated_threads::one_per_prio::private_dispatcher_t>,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::binding_actions_mixin_t>
::unbind_agent(binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_dedicated_threads::one_per_prio::private_dispatcher_t>,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::binding_actions_mixin_t>
               *this,environment_t *param_1,agent_ref_t *agent)

{
  proxy_dispatcher_t *ppVar1;
  intrusive_ptr_t<so_5::agent_t> local_10;
  
  local_10.m_obj = agent->m_obj;
  ppVar1 = this->m_instance;
  agent->m_obj = (agent_t *)0x0;
  (*(ppVar1->super_proxy_dispatcher_base_t).super_actual_disp_iface_t.super_dispatcher_t.
    _vptr_dispatcher_t[8])(ppVar1,(ulong)(local_10.m_obj)->m_priority);
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(&local_10);
  return;
}

Assistant:

virtual void
		unbind_agent(
			environment_t & /* env */,
			agent_ref_t agent ) override
			{
				this->do_unbind( m_instance, std::move( agent ) );
			}